

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O1

S2Cap * __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound
          (S2Cap *__return_storage_ptr__,S2ShapeIndexRegion<S2ShapeIndex> *this)

{
  vector<S2CellId,_std::allocator<S2CellId>_> covering;
  vector<S2CellId,_std::allocator<S2CellId>_> local_48;
  S2CellUnion local_28;
  
  local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  GetCellUnionBound(this,&local_48);
  local_28.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_28.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_28.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2CellUnion_002c1838;
  S2CellUnion::Normalize(&local_28);
  S2CellUnion::GetCapBound(__return_storage_ptr__,&local_28);
  if (local_28.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2ShapeIndexRegion<IndexType>::GetCapBound() const {
  std::vector<S2CellId> covering;
  GetCellUnionBound(&covering);
  return S2CellUnion(std::move(covering)).GetCapBound();
}